

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O0

apx_error_t
create_ports_on_node_instance
          (apx_nodeManager_t *self,apx_nodeInstance_t *node_instance,apx_node_t *node,
          apx_size_t *expected_provide_port_data_size,apx_size_t *expected_require_port_data_size)

{
  uint32_t local_7c;
  apx_program_t *paStack_78;
  apx_size_t data_size_1;
  apx_program_t *unpack_program;
  apx_program_t *pack_program_1;
  apx_port_t *port_1;
  apx_program_t *paStack_58;
  apx_size_t data_size;
  apx_program_t *pack_program;
  apx_port_t *port;
  apx_size_t local_40;
  apx_size_t port_id;
  apx_size_t data_offset;
  apx_size_t num_require_ports;
  apx_size_t num_provide_ports;
  apx_error_t result;
  apx_size_t *expected_require_port_data_size_local;
  apx_size_t *expected_provide_port_data_size_local;
  apx_node_t *node_local;
  apx_nodeInstance_t *node_instance_local;
  apx_nodeManager_t *self_local;
  
  _num_provide_ports = expected_require_port_data_size;
  expected_require_port_data_size_local = expected_provide_port_data_size;
  expected_provide_port_data_size_local = (apx_size_t *)node;
  node_local = (apx_node_t *)node_instance;
  node_instance_local = (apx_nodeInstance_t *)self;
  if ((((self == (apx_nodeManager_t *)0x0) || (node_instance == (apx_nodeInstance_t *)0x0)) ||
      (node == (apx_node_t *)0x0)) ||
     ((expected_provide_port_data_size == (apx_size_t *)0x0 ||
      (expected_require_port_data_size == (apx_size_t *)0x0)))) {
    __assert_fail("(self != NULL) && (node_instance != NULL) && (node != NULL) && (expected_provide_port_data_size != NULL) && (expected_require_port_data_size != NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                  ,0x187,
                  "apx_error_t create_ports_on_node_instance(apx_nodeManager_t *, apx_nodeInstance_t *, const apx_node_t *, apx_size_t *, apx_size_t *)"
                 );
  }
  num_require_ports = 0;
  data_offset = apx_node_num_provide_ports(node);
  port_id = apx_node_num_require_ports((apx_node_t *)expected_provide_port_data_size_local);
  local_40 = 0;
  num_require_ports =
       apx_nodeInstance_alloc_port_instance_memory
                 ((apx_nodeInstance_t *)node_local,data_offset,port_id);
  if (num_require_ports == 0) {
    for (port._4_4_ = 0; port._4_4_ < data_offset; port._4_4_ = port._4_4_ + 1) {
      pack_program = (apx_program_t *)
                     apx_node_get_provide_port
                               ((apx_node_t *)expected_provide_port_data_size_local,port._4_4_);
      port_1._4_4_ = 0;
      if ((apx_port_t *)pack_program == (apx_port_t *)0x0) {
        __assert_fail("port != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                      ,0x195,
                      "apx_error_t create_ports_on_node_instance(apx_nodeManager_t *, apx_nodeInstance_t *, const apx_node_t *, apx_size_t *, apx_size_t *)"
                     );
      }
      paStack_58 = apx_compiler_compile_port
                             ((apx_compiler_t *)&node_instance_local->definition_file,
                              (apx_port_t *)pack_program,'\x01',(apx_error_t *)&num_require_ports);
      if (num_require_ports == 0) {
        num_require_ports =
             apx_nodeInstance_create_provide_port
                       ((apx_nodeInstance_t *)node_local,port._4_4_,
                        *(char **)&pack_program->u32GrowSize,paStack_58,local_40,
                        (uint32_t *)((long)&port_1 + 4));
        if (num_require_ports != 0) {
          adt_bytearray_delete(paStack_58);
          break;
        }
        local_40 = port_1._4_4_ + local_40;
      }
    }
    *expected_require_port_data_size_local = local_40;
    local_40 = 0;
    if (num_require_ports == 0) {
      for (port._4_4_ = 0; port._4_4_ < port_id; port._4_4_ = port._4_4_ + 1) {
        pack_program_1 =
             (apx_program_t *)
             apx_node_get_require_port
                       ((apx_node_t *)expected_provide_port_data_size_local,port._4_4_);
        unpack_program = (apx_program_t *)0x0;
        paStack_78 = (apx_program_t *)0x0;
        local_7c = 0;
        if ((apx_port_t *)pack_program_1 == (apx_port_t *)0x0) {
          __assert_fail("port != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                        ,0x1af,
                        "apx_error_t create_ports_on_node_instance(apx_nodeManager_t *, apx_nodeInstance_t *, const apx_node_t *, apx_size_t *, apx_size_t *)"
                       );
        }
        unpack_program =
             apx_compiler_compile_port
                       ((apx_compiler_t *)&node_instance_local->definition_file,
                        (apx_port_t *)pack_program_1,'\x01',(apx_error_t *)&num_require_ports);
        if (num_require_ports == 0) {
          paStack_78 = apx_compiler_compile_port
                                 ((apx_compiler_t *)&node_instance_local->definition_file,
                                  (apx_port_t *)pack_program_1,'\0',
                                  (apx_error_t *)&num_require_ports);
        }
        if (num_require_ports == 0) {
          num_require_ports =
               apx_nodeInstance_create_require_port
                         ((apx_nodeInstance_t *)node_local,port._4_4_,
                          *(char **)&pack_program_1->u32GrowSize,unpack_program,paStack_78,local_40,
                          &local_7c);
          if (num_require_ports != 0) {
            adt_bytearray_delete(unpack_program);
            adt_bytearray_delete(paStack_78);
            break;
          }
          local_40 = local_7c + local_40;
        }
      }
      *_num_provide_ports = local_40;
    }
  }
  if (num_require_ports == 0) {
    num_require_ports =
         create_data_element_list_on_node_instance
                   ((apx_nodeInstance_t *)node_local,
                    (apx_node_t *)expected_provide_port_data_size_local);
  }
  if (num_require_ports == 0) {
    num_require_ports =
         create_computation_list_on_node_instance
                   ((apx_nodeInstance_t *)node_local,
                    (apx_node_t *)expected_provide_port_data_size_local);
  }
  if ((num_require_ports == 0) && (*(char *)&node_instance_local[1].require_port_changes == '\x02'))
  {
    num_require_ports = create_port_signatures_on_node_instance((apx_nodeInstance_t *)node_local);
  }
  return num_require_ports;
}

Assistant:

static apx_error_t create_ports_on_node_instance(apx_nodeManager_t* self, apx_nodeInstance_t* node_instance, apx_node_t const* node,
   apx_size_t* expected_provide_port_data_size, apx_size_t* expected_require_port_data_size)
{
   assert( (self != NULL) && (node_instance != NULL) && (node != NULL) &&
      (expected_provide_port_data_size != NULL) && (expected_require_port_data_size != NULL));
   apx_error_t result = APX_NO_ERROR;
   apx_size_t const num_provide_ports = (apx_size_t)apx_node_num_provide_ports(node);
   apx_size_t const num_require_ports = (apx_size_t)apx_node_num_require_ports(node);
   apx_size_t data_offset = 0u;
   result = apx_nodeInstance_alloc_port_instance_memory(node_instance, num_provide_ports, num_require_ports);
   if (result == APX_NO_ERROR)
   {
      apx_size_t port_id;
      for (port_id = 0u; port_id < num_provide_ports; port_id++)
      {
         apx_port_t* port = apx_node_get_provide_port(node, port_id);
         apx_program_t* pack_program;
         apx_size_t data_size = 0u;
         assert(port != NULL);
         pack_program = apx_compiler_compile_port(&self->compiler, port, APX_PACK_PROGRAM, &result);
         if (result == APX_NO_ERROR)
         {
            result = apx_nodeInstance_create_provide_port(node_instance, port_id, port->name, pack_program, data_offset, &data_size);
            if (result == APX_NO_ERROR)
            {
               data_offset += data_size;
            }
            else
            {
               APX_PROGRAM_DELETE(pack_program);
               break;
            }
         }
      }
      *expected_provide_port_data_size = data_offset;
      data_offset = 0u;
      if (result == APX_NO_ERROR)
      {
         for (port_id = 0u; port_id < num_require_ports; port_id++)
         {
            apx_port_t* port = apx_node_get_require_port(node, port_id);
            apx_program_t* pack_program = NULL;
            apx_program_t* unpack_program = NULL;
            apx_size_t data_size = 0u;
            assert(port != NULL);
            pack_program = apx_compiler_compile_port(&self->compiler, port, APX_PACK_PROGRAM, &result);
            if (result == APX_NO_ERROR)
            {
               unpack_program = apx_compiler_compile_port(&self->compiler, port, APX_UNPACK_PROGRAM, &result);
            }
            if (result == APX_NO_ERROR)
            {
               result = apx_nodeInstance_create_require_port(node_instance, port_id, port->name, pack_program, unpack_program, data_offset, &data_size);
               if (result == APX_NO_ERROR)
               {
                  data_offset += data_size;
               }
               else
               {
                  APX_PROGRAM_DELETE(pack_program);
                  APX_PROGRAM_DELETE(unpack_program);
                  break;
               }
            }
         }
         *expected_require_port_data_size = data_offset;
      }
   }
   if (result == APX_NO_ERROR)
   {
      result = create_data_element_list_on_node_instance(node_instance, node);
   }
   if (result == APX_NO_ERROR)
   {
      result = create_computation_list_on_node_instance(node_instance, node);
   }
   if ( (result == APX_NO_ERROR) && (self->mode == APX_SERVER_MODE) )
   {
      result = create_port_signatures_on_node_instance(node_instance);
   }
   return result;
}